

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall
ON_PointCloud::GetBBox(ON_PointCloud *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  bool bVar1;
  double dVar2;
  
  this_00 = &this->m_bbox;
  bVar1 = ON_BoundingBox::IsValid(this_00);
  if (!bVar1) {
    ON_3dPointArray::GetBBox(&this->m_P,(double *)this_00,&(this->m_bbox).m_max.x,false);
  }
  bVar1 = ON_BoundingBox::IsValid(this_00);
  if (!bVar1) {
    return bVar1;
  }
  if (bGrowBox) {
    if (boxmin != (double *)0x0) {
      dVar2 = (this_00->m_min).x;
      if (dVar2 < *boxmin) {
        *boxmin = dVar2;
      }
      dVar2 = (this->m_bbox).m_min.y;
      if (dVar2 < boxmin[1]) {
        boxmin[1] = dVar2;
      }
      dVar2 = (this->m_bbox).m_min.z;
      if (dVar2 < boxmin[2]) {
        boxmin[2] = dVar2;
      }
    }
    if (boxmax == (double *)0x0) {
      return bVar1;
    }
    dVar2 = (this->m_bbox).m_max.x;
    if (*boxmax <= dVar2 && dVar2 != *boxmax) {
      *boxmax = dVar2;
    }
    dVar2 = (this->m_bbox).m_max.y;
    if (boxmax[1] <= dVar2 && dVar2 != boxmax[1]) {
      boxmax[1] = dVar2;
    }
    dVar2 = (this->m_bbox).m_max.z;
    if (dVar2 < boxmax[2] || dVar2 == boxmax[2]) {
      return bVar1;
    }
  }
  else {
    if (boxmin != (double *)0x0) {
      *boxmin = (this->m_bbox).m_min.x;
      boxmin[1] = (this->m_bbox).m_min.y;
      boxmin[2] = (this->m_bbox).m_min.z;
    }
    if (boxmax == (double *)0x0) {
      return bVar1;
    }
    *boxmax = (this->m_bbox).m_max.x;
    boxmax[1] = (this->m_bbox).m_max.y;
    dVar2 = (this->m_bbox).m_max.z;
  }
  boxmax[2] = dVar2;
  return bVar1;
}

Assistant:

bool ON_PointCloud::GetBBox( // returns true if successful
       double* boxmin,    // minimum
       double* boxmax,    // maximum
       bool bGrowBox  // true means grow box
       ) const
{
  if ( !m_bbox.IsValid() ) {
    m_P.GetBBox( (double*)&m_bbox.m_min.x, (double*)&m_bbox.m_max.x, false );
  }
  bool rc = m_bbox.IsValid();
  if (rc) {
    if ( bGrowBox ) {
      if ( boxmin ) {
        if ( boxmin[0] > m_bbox.m_min.x ) boxmin[0] = m_bbox.m_min.x;
        if ( boxmin[1] > m_bbox.m_min.y ) boxmin[1] = m_bbox.m_min.y;
        if ( boxmin[2] > m_bbox.m_min.z ) boxmin[2] = m_bbox.m_min.z;
      }
      if ( boxmax ) {
        if ( boxmax[0] < m_bbox.m_max.x ) boxmax[0] = m_bbox.m_max.x;
        if ( boxmax[1] < m_bbox.m_max.y ) boxmax[1] = m_bbox.m_max.y;
        if ( boxmax[2] < m_bbox.m_max.z ) boxmax[2] = m_bbox.m_max.z;
      }
    }
    else {
      if ( boxmin ) {
        boxmin[0] = m_bbox.m_min.x;
        boxmin[1] = m_bbox.m_min.y;
        boxmin[2] = m_bbox.m_min.z;
      }
      if ( boxmax ) {
        boxmax[0] = m_bbox.m_max.x;
        boxmax[1] = m_bbox.m_max.y;
        boxmax[2] = m_bbox.m_max.z;
      }
    }
  }
  return rc;
}